

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-utils.c
# Opt level: O0

int coda_isPlusInf(double x)

{
  anon_union_8_2_0fbd0823 mkInf;
  uint64_t plusinf;
  double x_local;
  
  return (int)(x == INFINITY);
}

Assistant:

LIBCODA_API int coda_isPlusInf(double x)
{
    uint64_t plusinf;

    union
    {
        uint64_t as_int;
        double as_double;
    } mkInf;

    mkInf.as_double = x;

    plusinf = 0x7ff0;
    plusinf <<= 48;

    return mkInf.as_int == plusinf;
}